

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

void __thiscall OpenMD::Thermo::getGyrationalVolume(Thermo *this,RealType *volume,RealType *detI)

{
  int iVar1;
  SnapshotManager *this_00;
  double *in_RDX;
  RealType *in_RSI;
  undefined8 *in_RDI;
  double dVar2;
  double dVar3;
  RealType RVar4;
  RealType geomCnst;
  RealType sysconstants;
  Vector3d dummyAngMom;
  Mat3x3d intTensor;
  Snapshot *snap;
  Vector3d *in_stack_00000480;
  Mat3x3d *in_stack_00000488;
  Thermo *in_stack_00000490;
  Snapshot *in_stack_fffffffffffffed8;
  SquareMatrix3<double> local_e8;
  double local_a0;
  double local_98;
  SquareMatrix3<double> local_68;
  Snapshot *local_20;
  double *local_18;
  RealType *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  local_20 = SnapshotManager::getCurrentSnapshot(this_00);
  if (((local_20->hasInertiaTensor & 1U) == 0) || ((local_20->hasGyrationalVolume & 1U) == 0)) {
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x183617);
    Vector3<double>::Vector3((Vector3<double> *)0x183624);
    local_a0 = 1.5;
    getInertiaTensor(in_stack_00000490,in_stack_00000488,in_stack_00000480);
    dVar2 = SquareMatrix3<double>::determinant(&local_68);
    dVar3 = local_a0;
    *local_18 = dVar2;
    iVar1 = SimInfo::getNGlobalIntegrableObjects((SimInfo *)*in_RDI);
    local_98 = dVar3 / (double)iVar1;
    dVar3 = pow(local_98,local_a0);
    dVar2 = sqrt(*local_18);
    *local_10 = dVar3 * 4.1887902047863905 * dVar2;
    Snapshot::setGyrationalVolume(local_20,*local_10);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x183733);
  }
  else {
    RVar4 = Snapshot::getGyrationalVolume(local_20);
    *local_10 = RVar4;
    Snapshot::getInertiaTensor(in_stack_fffffffffffffed8);
    dVar3 = SquareMatrix3<double>::determinant(&local_e8);
    *local_18 = dVar3;
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1837bc);
  }
  return;
}

Assistant:

void Thermo::getGyrationalVolume(RealType& volume, RealType& detI) {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!(snap->hasInertiaTensor && snap->hasGyrationalVolume)) {
      Mat3x3d intTensor;
      Vector3d dummyAngMom;
      RealType sysconstants;
      RealType geomCnst;

      geomCnst = 3.0 / 2.0;
      /* Get the inertia tensor and angular momentum for free*/
      this->getInertiaTensor(intTensor, dummyAngMom);

      detI = intTensor.determinant();
      sysconstants =
          geomCnst / (RealType)(info_->getNGlobalIntegrableObjects());
      volume =
          4.0 / 3.0 * Constants::PI * pow(sysconstants, geomCnst) * sqrt(detI);
      snap->setGyrationalVolume(volume);
    } else {
      volume = snap->getGyrationalVolume();
      detI   = snap->getInertiaTensor().determinant();
    }
    return;
  }